

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

const_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
          (const_iterator *__return_storage_ptr__,
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *this)

{
  __return_storage_ptr__->map = this;
  (__return_storage_ptr__->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
  data_ = (pointer)(__return_storage_ptr__->path).path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
  (__return_storage_ptr__->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
  len = 0;
  (__return_storage_ptr__->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
  cap = 2;
  const_iterator::setToBegin(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const {
        const_iterator it(*this);
        it.setToBegin();
        return it;
    }